

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

void __thiscall
Assimp::BlenderImporter::BuildDefaultMaterial(BlenderImporter *this,ConversionData *conv_data)

{
  pointer ppaVar1;
  aiMesh *paVar2;
  Material *__p;
  size_type sVar3;
  pointer ppaVar4;
  shared_ptr<Assimp::Blender::Material> p;
  
  ppaVar1 = (conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  sVar3 = 0xffffffffffffffff;
  for (ppaVar4 = (conv_data->meshes).arr.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppaVar4 != ppaVar1; ppaVar4 = ppaVar4 + 1
      ) {
    paVar2 = *ppaVar4;
    if (paVar2->mMaterialIndex == 0xffffffff) {
      if ((int)sVar3 == -1) {
        __p = (Material *)operator_new(0x6b8);
        memset(__p,0,0x5a0);
        (__p->super_ElemBase)._vptr_ElemBase = (_func_int **)&PTR__Material_00733e60;
        (__p->id).super_ElemBase._vptr_ElemBase = (_func_int **)&PTR__ElemBase_00733df0;
        (__p->group).super___shared_ptr<Assimp::Blender::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (__p->group).super___shared_ptr<Assimp::Blender::Group,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        memset(__p->mtex,0,0x120);
        std::__shared_ptr<Assimp::Blender::Material,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<Assimp::Blender::Material,void>
                  ((__shared_ptr<Assimp::Blender::Material,(__gnu_cxx::_Lock_policy)2> *)&p,__p);
        builtin_strncpy(((p.
                          super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->id).name + 2,"DefaultM",8);
        builtin_strncpy(((p.
                          super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->id).name + 10,"aterial",8);
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->specg
             = 0.6;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->specb
             = 0.6;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->r =
             0.6;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->g =
             0.6;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->b =
             0.6;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->specr
             = 0.6;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->alpha
             = 0.0;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->har =
             0;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ambr =
             0.0;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ambg =
             0.0;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ambb =
             0.0;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mirr =
             0.0;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mirr =
             0.0;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mirg =
             0.0;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mirb =
             0.0;
        (p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->emit =
             0.0;
        sVar3 = std::
                deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
                ::size(&conv_data->materials_raw);
        std::
        deque<std::shared_ptr<Assimp::Blender::Material>,_std::allocator<std::shared_ptr<Assimp::Blender::Material>_>_>
        ::push_back(&conv_data->materials_raw,(value_type *)&p);
        LogFunctions<Assimp::BlenderImporter>::LogInfo((char *)0x45f124);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&p.super___shared_ptr<Assimp::Blender::Material,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      paVar2->mMaterialIndex = (uint)sVar3;
    }
  }
  return;
}

Assistant:

void BlenderImporter::BuildDefaultMaterial(Blender::ConversionData& conv_data)
{
    // add a default material if necessary
    unsigned int index = static_cast<unsigned int>( -1 );
    for( aiMesh* mesh : conv_data.meshes.get() ) {
        if (mesh->mMaterialIndex == static_cast<unsigned int>( -1 )) {

            if (index == static_cast<unsigned int>( -1 )) {
                // Setup a default material.
                std::shared_ptr<Material> p(new Material());
                ai_assert(::strlen(AI_DEFAULT_MATERIAL_NAME) < sizeof(p->id.name)-2);
                strcpy( p->id.name+2, AI_DEFAULT_MATERIAL_NAME );

                // Note: MSVC11 does not zero-initialize Material here, although it should.
                // Thus all relevant fields should be explicitly initialized. We cannot add
                // a default constructor to Material since the DNA codegen does not support
                // parsing it.
                p->r = p->g = p->b = 0.6f;
                p->specr = p->specg = p->specb = 0.6f;
                p->ambr = p->ambg = p->ambb = 0.0f;
                p->mirr = p->mirg = p->mirb = 0.0f;
                p->emit = 0.f;
                p->alpha = 0.f;
                p->har = 0;

                index = static_cast<unsigned int>( conv_data.materials_raw.size() );
                conv_data.materials_raw.push_back(p);
                LogInfo("Adding default material");
            }
            mesh->mMaterialIndex = index;
        }
    }
}